

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsonIO.cc
# Opt level: O1

Token __thiscall avro::json::JsonParser::doAdvance(JsonParser *this)

{
  State *__args;
  char *pcVar1;
  byte c;
  State SVar2;
  Token TVar3;
  _Elt_pointer pSVar4;
  Exception *__return_storage_ptr__;
  size_t n;
  Token TVar5;
  JsonParser *in_RSI;
  JsonParser *this_00;
  
  c = next(this);
  if (c < 0x5d) {
    if (c == 0x2c) {
      if (this->curState != stArrayN) {
        if (this->curState != stObjectN) {
          __return_storage_ptr__ = (Exception *)__cxa_allocate_exception(0x18);
          unexpected(__return_storage_ptr__,in_RSI,',');
          goto LAB_00174513;
        }
        this->curState = stObject0;
      }
    }
    else {
      if (c != 0x3a) goto LAB_0017430f;
      if (this->curState != stKey) {
        __return_storage_ptr__ = (Exception *)__cxa_allocate_exception(0x18);
        unexpected(__return_storage_ptr__,in_RSI,':');
        goto LAB_00174513;
      }
      this->curState = stObjectN;
    }
    c = next(this);
  }
  else {
    if (c == 0x7d) {
      pSVar4 = (this->stateStack).c.
               super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar4 == (this->stateStack).c.
                    super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar4 = (this->stateStack).c.
                 super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      this->curState = pSVar4[-1];
      std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>::
      pop_back((deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                *)this);
      return tkObjectEnd;
    }
    if (c == 0x5d) {
      pSVar4 = (this->stateStack).c.
               super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar4 == (this->stateStack).c.
                    super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pSVar4 = (this->stateStack).c.
                 super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x80;
      }
      this->curState = pSVar4[-1];
      std::deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>::
      pop_back((deque<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                *)this);
      return tkArrayEnd;
    }
  }
LAB_0017430f:
  __args = &this->curState;
  if (this->curState == stArray0) {
    SVar2 = stArrayN;
LAB_0017437d:
    *__args = SVar2;
  }
  else if (this->curState == stObject0) {
    SVar2 = stKey;
    if (c != 0x22) {
      __return_storage_ptr__ = (Exception *)__cxa_allocate_exception(0x18);
      unexpected(__return_storage_ptr__,in_RSI,c);
      goto LAB_00174513;
    }
    goto LAB_0017437d;
  }
  if (c < 0x6e) {
    if (c == 0x22) {
      tryString(this);
      return tkString;
    }
    if (c == 0x5b) {
      pSVar4 = (this->stateStack).c.
               super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pSVar4 == (this->stateStack).c.
                    super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
        std::deque<avro::json::JsonParser::State,std::allocator<avro::json::JsonParser::State>>::
        _M_push_back_aux<avro::json::JsonParser::State_const&>
                  ((deque<avro::json::JsonParser::State,std::allocator<avro::json::JsonParser::State>>
                    *)this,__args);
      }
      else {
        *pSVar4 = this->curState;
        (this->stateStack).c.
        super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur = pSVar4 + 1;
      }
      *__args = stArray0;
      return tkArrayStart;
    }
    if (c != 0x66) {
LAB_0017441e:
      this_00 = (JsonParser *)(ulong)(uint)(int)(char)c;
      if ((c == 0x2d) || ((int)(char)c - 0x30U < 10)) {
        TVar3 = tryNumber(this,c);
        return TVar3;
      }
      __return_storage_ptr__ = (Exception *)__cxa_allocate_exception(0x18);
      unexpected(__return_storage_ptr__,this_00,c);
LAB_00174513:
      __cxa_throw(__return_storage_ptr__,&Exception::typeinfo,Exception::~Exception);
    }
    this->bv = false;
    pcVar1 = "false";
    n = 4;
  }
  else {
    if (c == 0x6e) {
      pcVar1 = "Null";
      TVar5 = tkNull;
      n = 3;
      TVar3 = tkNull;
      goto LAB_00174483;
    }
    if (c != 0x74) {
      if (c == 0x7b) {
        pSVar4 = (this->stateStack).c.
                 super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (pSVar4 == (this->stateStack).c.
                      super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
          std::deque<avro::json::JsonParser::State,std::allocator<avro::json::JsonParser::State>>::
          _M_push_back_aux<avro::json::JsonParser::State_const&>
                    ((deque<avro::json::JsonParser::State,std::allocator<avro::json::JsonParser::State>>
                      *)this,__args);
        }
        else {
          *pSVar4 = this->curState;
          (this->stateStack).c.
          super__Deque_base<avro::json::JsonParser::State,_std::allocator<avro::json::JsonParser::State>_>
          ._M_impl.super__Deque_impl_data._M_finish._M_cur = pSVar4 + 1;
        }
        *__args = stObject0;
        return tkObjectStart;
      }
      goto LAB_0017441e;
    }
    this->bv = true;
    pcVar1 = "true";
    n = 3;
  }
  TVar5 = tkBool;
  TVar3 = tkBool;
LAB_00174483:
  tryLiteral(this,pcVar1 + 1,n,TVar3);
  return TVar5;
}

Assistant:

JsonParser::Token JsonParser::doAdvance()
{
    char ch = next();
    if (ch == ']') {
        if (curState == stArray0 || stArrayN) {
            curState = stateStack.top();
            stateStack.pop();
            return tkArrayEnd;
        } else {
            throw unexpected(ch);
        }
    } else if (ch == '}') {
        if (curState == stObject0 || stObjectN) {
            curState = stateStack.top();
            stateStack.pop();
            return tkObjectEnd;
        } else {
            throw unexpected(ch);
        }
    } else if (ch == ',') {
        if (curState != stObjectN && curState != stArrayN) {
            throw unexpected(ch);
        }
        if (curState == stObjectN) {
            curState = stObject0;
        }
        ch = next();
    } else if (ch == ':') {
        if (curState != stKey) {
            throw unexpected(ch);
        }
        curState = stObjectN;
        ch = next();
    }

    if (curState == stObject0) {
        if (ch != '"') {
            throw unexpected(ch);
        }
        curState = stKey;
    } else if (curState == stArray0) {
        curState = stArrayN;
    }

    switch (ch) {
    case '[':
        stateStack.push(curState);
        curState = stArray0;
        return tkArrayStart;
    case '{':
        stateStack.push(curState);
        curState = stObject0;
        return tkObjectStart;
    case '"':
        return tryString();
    case 't':
        bv = true;
        return tryLiteral("rue", 3, tkBool);
    case 'f':
        bv = false;
        return tryLiteral("alse", 4, tkBool);
    case 'n':
        return tryLiteral("ull", 3, tkNull);
    default:
        if (isdigit(ch) || ch == '-') {
            return tryNumber(ch);
        } else {
            throw unexpected(ch);
        }
    }
}